

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O0

pair<const_void_*,_int> __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FindExtension
          (DescriptorIndex *this,string_view containing_type,int field_number)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  pointer pEVar2;
  reference this_00;
  Value VVar3;
  pair<const_void_*,_int> pVar4;
  int local_b0 [2];
  pair<std::nullptr_t,_int> local_a8;
  DescriptorIndex *local_98;
  size_t local_90;
  string_view local_88;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_78;
  DescriptorIndex *local_70;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_int> local_68;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_50;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_48;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  local_40;
  __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
  it;
  int field_number_local;
  DescriptorIndex *this_local;
  string_view containing_type_local;
  int local_10;
  
  containing_type_local._M_len = (size_t)containing_type._M_str;
  this_local = (DescriptorIndex *)containing_type._M_len;
  it._M_current._4_4_ = field_number;
  EnsureFlat(this);
  local_48._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::begin(&this->by_extension_flat_);
  local_50._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::end(&this->by_extension_flat_);
  std::make_tuple<std::basic_string_view<char,std::char_traits<char>>&,int&>
            (&local_68,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             (int *)((long)&it._M_current + 4));
  local_70 = (DescriptorIndex *)
             absl::lts_20250127::container_internal::
             btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
             ::key_comp((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>,_256,_false>_>_>
                         *)&this->by_extension_);
  local_40 = std::
             lower_bound<__gnu_cxx::__normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry*,std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>>>,std::tuple<std::basic_string_view<char,std::char_traits<char>>,int>,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionCompare>
                       (local_48,local_50,&local_68,(ExtensionCompare)local_70);
  local_78._M_current =
       (ExtensionEntry *)
       std::
       vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>
       ::end(&this->by_extension_flat_);
  bVar1 = __gnu_cxx::operator==(&local_40,&local_78);
  if (!bVar1) {
    pEVar2 = __gnu_cxx::
             __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
             ::operator->(&local_40);
    local_88 = ExtensionEntry::extendee(pEVar2,this);
    local_98 = this_local;
    local_90 = containing_type_local._M_len;
    __y._M_str = (char *)containing_type_local._M_len;
    __y._M_len = (size_t)this_local;
    bVar1 = std::operator!=(local_88,__y);
    if (!bVar1) {
      pEVar2 = __gnu_cxx::
               __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
               ::operator->(&local_40);
      if (pEVar2->extension_number == it._M_current._4_4_) {
        pEVar2 = __gnu_cxx::
                 __normal_iterator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry_*,_std::vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::ExtensionEntry>_>_>
                 ::operator->(&local_40);
        this_00 = std::
                  vector<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::EncodedEntry>_>
                  ::operator[](&this->all_values_,(long)pEVar2->data_offset);
        VVar3 = EncodedEntry::value(this_00);
        containing_type_local._M_str = (char *)VVar3.first;
        local_10 = VVar3.second;
        goto LAB_0026e159;
      }
    }
  }
  local_b0[0] = 0;
  local_b0[1] = 0;
  std::make_pair<decltype(nullptr),int>(&local_a8.first,local_b0);
  std::pair<const_void_*,_int>::pair<std::nullptr_t,_int,_true>
            ((pair<const_void_*,_int> *)&containing_type_local._M_str,&local_a8);
LAB_0026e159:
  pVar4.second = local_10;
  pVar4.first = containing_type_local._M_str;
  pVar4._12_4_ = 0;
  return pVar4;
}

Assistant:

std::pair<const void*, int>
EncodedDescriptorDatabase::DescriptorIndex::FindExtension(
    absl::string_view containing_type, int field_number) {
  EnsureFlat();

  auto it = std::lower_bound(
      by_extension_flat_.begin(), by_extension_flat_.end(),
      std::make_tuple(containing_type, field_number), by_extension_.key_comp());
  return it == by_extension_flat_.end() ||
                 it->extendee(*this) != containing_type ||
                 it->extension_number != field_number
             ? std::make_pair(nullptr, 0)
             : all_values_[it->data_offset].value();
}